

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbifnet.cpp
# Opt level: O1

int match_url_domain(char *url,size_t urll,char *domain)

{
  int iVar1;
  size_t len;
  long lVar2;
  size_t sVar3;
  
  len = strlen(domain);
  if (urll != 0) {
    lVar2 = 0;
    sVar3 = 0;
    do {
      if ((3 < urll + lVar2) && (url[sVar3 + 2] == '/' && *(short *)(url + sVar3) == 0x2f3a)) {
        if ((urll - sVar3) - 3 < len) {
          return 0;
        }
        iVar1 = memicmp(url + sVar3 + 3,domain,len);
        if (iVar1 != 0) {
          return 0;
        }
        if ((urll - len) - 3 == sVar3) {
          return 1;
        }
        if (url[sVar3 + 3 + len] == ':') {
          return 1;
        }
        return (uint)(url[sVar3 + 3 + len] == '/');
      }
      sVar3 = sVar3 + 1;
      lVar2 = lVar2 + -1;
    } while (urll != sVar3);
  }
  return 0;
}

Assistant:

static int match_url_domain(const char *url, size_t urll, const char *domain)
{
    /* note the length of the domain name we're matching */
    size_t domainl = strlen(domain);

    /* scan to the end of the scheme name */
    for ( ; urll > 0 ; ++url, --urll)
    {
        /* the scheme name ends in "://" */
        if (urll > 3 && memcmp(url, "://", 3) == 0)
        {
            /* skip the :// sequence */
            url += 3;
            urll -= 3;

            /* 
             *   we have a match if the domain name follows, and either it's
             *   the whole rest of the string, or the next character after
             *   the domain name is '/' or ':' 
             */
            return (urll >= domainl
                    && memicmp(url, domain, domainl) == 0
                    && (urll == domainl
                        || url[domainl] == ':'
                        || url[domainl] == '/'));
        }
    }

    /* didn't find the end of the scheme name - fail */
    return FALSE;
}